

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall ctemplate::Template::ReloadIfChangedLocked(Template *this)

{
  string *resolved;
  HtmlParser *this_00;
  bool bVar1;
  ostream *poVar2;
  File *this_01;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  string *unresolved;
  char *file_buffer;
  size_t buflen;
  FileStat statbuf;
  char *local_d8;
  ulong local_d0;
  FileStat local_c8;
  
  if ((this->original_filename_)._M_string_length == 0) {
    return false;
  }
  resolved = &this->resolved_filename_;
  if ((this->resolved_filename_)._M_string_length == 0) {
    unresolved = (string *)&this->original_filename_;
    bVar1 = TemplateCache::ResolveTemplateFilename
                      (this->template_cache_,(string *)unresolved,resolved,&local_c8);
    if (bVar1) goto LAB_00123687;
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    poVar2 = std::operator<<(poVar2,"Unable to locate file ");
LAB_0012370e:
    poVar2 = std::operator<<(poVar2,unresolved);
  }
  else {
    bVar1 = File::Stat(resolved,&local_c8);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
      poVar2 = std::operator<<(poVar2,"Unable to stat file ");
      unresolved = (string *)resolved;
      goto LAB_0012370e;
    }
LAB_00123687:
    if ((local_c8.internal_statbuf.st_mode & 0xf000) == 0x4000) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
      poVar2 = std::operator<<(poVar2,(string *)resolved);
      pcVar6 = "is a directory and thus not readable";
    }
    else {
      if (((local_c8.mtime == this->filename_mtime_) && (0 < this->filename_mtime_)) &&
         (this->tree_ != (SectionTemplateNode *)0x0)) {
        this->state_ = TS_READY;
        return false;
      }
      this_01 = File::Open((resolved->_M_dataplus)._M_p,"r");
      if (this_01 != (File *)0x0) {
        local_d0 = local_c8.length;
        pcVar6 = (char *)operator_new__(local_c8.length);
        local_d8 = pcVar6;
        sVar3 = File::Read(this_01,pcVar6,local_c8.length);
        if (sVar3 == local_c8.length) {
          File::Close(this_01);
          this->filename_mtime_ = local_c8.mtime;
          StripBuffer(this,&local_d8,&local_d0);
          this->initial_context_ = TC_MANUAL;
          this_00 = this->htmlparser_;
          if (this_00 != (HtmlParser *)0x0) {
            ctemplate_htmlparser::HtmlParser::~HtmlParser(this_00);
          }
          operator_delete(this_00);
          this->htmlparser_ = (HtmlParser *)0x0;
          bVar1 = BuildTree(this,local_d8,local_d8 + local_d0);
          if (!bVar1) {
            if (this->state_ != TS_READY) {
              return false;
            }
            __assert_fail("state() != TS_READY",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                          ,0xa81,"bool ctemplate::Template::ReloadIfChangedLocked()");
          }
          if (this->state_ != TS_READY) {
            __assert_fail("state() == TS_READY",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                          ,0xa7e,"bool ctemplate::Template::ReloadIfChangedLocked()");
          }
          return true;
        }
        poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
        poVar2 = std::operator<<(poVar2,"Error reading file ");
        poVar2 = std::operator<<(poVar2,(string *)resolved);
        poVar2 = std::operator<<(poVar2,": ");
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        poVar2 = std::operator<<(poVar2,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar2);
        File::Close(this_01);
        operator_delete__(pcVar6);
        goto LAB_0012371b;
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar2 = std::operator<<(poVar2,"Can\'t find file ");
      poVar2 = std::operator<<(poVar2,(string *)resolved);
      pcVar6 = "; skipping";
    }
    poVar2 = std::operator<<(poVar2,pcVar6);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_0012371b:
  this->state_ = TS_ERROR;
  return false;
}

Assistant:

bool VariableTemplateNode::Expand(ExpandEmitter *output_buffer,
                                  const TemplateDictionaryInterface *dictionary,
                                  PerExpandData* per_expand_data,
                                  const TemplateCache *cache) const {
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitOpenVariable(output_buffer,
                                                   token_.ToString());
  }

  const TemplateString value = dictionary->GetValue(variable_);

  if (AnyMightModify(token_.modvals, per_expand_data)) {
    EmitModifiedString(token_.modvals, value.data(), value.size(),
                       per_expand_data, output_buffer);
  } else {
    // No need to modify value, so just emit it.
    output_buffer->Emit(value.data(), value.size());
  }

  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitCloseVariable(output_buffer);
  }

  return true;
}